

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

MockSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)> * __thiscall
testing::internal::FunctionMocker<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::With
          (FunctionMocker<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *this,
          Matcher<int> *m1,Matcher<const_char_*> *m2,Matcher<__locale_struct_*> *m3)

{
  MockSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *pMVar1;
  FunctionMockerBase<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *in_RDI;
  ArgumentMatcherTuple *in_stack_ffffffffffffff68;
  
  pMVar1 = FunctionMockerBase<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::current_spec
                     (in_RDI);
  std::tr1::
  make_tuple<testing::Matcher<int>,testing::Matcher<char_const*>,testing::Matcher<__locale_struct*>>
            ((Matcher<int> *)pMVar1,(Matcher<const_char_*> *)in_RDI,
             (Matcher<__locale_struct_*> *)in_stack_ffffffffffffff68);
  MockSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::SetMatchers
            ((MockSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *)in_RDI,
             in_stack_ffffffffffffff68);
  std::tr1::
  tuple<testing::Matcher<int>,_testing::Matcher<const_char_*>,_testing::Matcher<__locale_struct_*>,_void,_void,_void,_void,_void,_void,_void>
  ::~tuple((tuple<testing::Matcher<int>,_testing::Matcher<const_char_*>,_testing::Matcher<__locale_struct_*>,_void,_void,_void,_void,_void,_void,_void>
            *)in_RDI);
  pMVar1 = FunctionMockerBase<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::current_spec
                     (in_RDI);
  return pMVar1;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1, const Matcher<A2>& m2,
      const Matcher<A3>& m3) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1, m2, m3));
    return this->current_spec();
  }